

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

void duckdb_brotli::BrotliCalculateRingBufferSize(BrotliDecoderStateInternal *s)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  uVar1 = *(uint *)&s->field_0x304;
  iVar2 = 1 << ((byte)(uVar1 >> 6) & 0x1f);
  iVar4 = s->ringbuffer_size;
  iVar3 = 0x400;
  if (iVar4 != 0) {
    iVar3 = iVar4;
  }
  if ((char)((uVar1 & 4) >> 2) == '\0' && iVar4 != iVar2) {
    if (s->ringbuffer == (uint8_t *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = s->pos;
    }
    iVar4 = iVar4 + s->meta_block_remaining_len;
    if (iVar4 < iVar3) {
      iVar4 = iVar3;
    }
    iVar3 = iVar2;
    if ((uVar1 & 0x10) != 0) {
      do {
        iVar2 = iVar3;
        iVar3 = iVar2 >> 1;
      } while (iVar4 <= iVar2 >> 1);
    }
    s->new_ringbuffer_size = iVar2;
  }
  return;
}

Assistant:

static void BROTLI_NOINLINE BrotliCalculateRingBufferSize(BrotliDecoderState *s) {
	int window_size = 1 << s->window_bits;
	int new_ringbuffer_size = window_size;
	/* We need at least 2 bytes of ring buffer size to get the last two
	   bytes for context from there */
	int min_size = s->ringbuffer_size ? s->ringbuffer_size : 1024;
	int output_size;

	/* If maximum is already reached, no further extension is retired. */
	if (s->ringbuffer_size == window_size) {
		return;
	}

	/* Metadata blocks does not touch ring buffer. */
	if (s->is_metadata) {
		return;
	}

	if (!s->ringbuffer) {
		output_size = 0;
	} else {
		output_size = s->pos;
	}
	output_size += s->meta_block_remaining_len;
	min_size = min_size < output_size ? output_size : min_size;

	if (!!s->canny_ringbuffer_allocation) {
		/* Reduce ring buffer size to save memory when server is unscrupulous.
		   In worst case memory usage might be 1.5x bigger for a short period of
		   ring buffer reallocation. */
		while ((new_ringbuffer_size >> 1) >= min_size) {
			new_ringbuffer_size >>= 1;
		}
	}

	s->new_ringbuffer_size = new_ringbuffer_size;
}